

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureGatherTests.cpp
# Opt level: O2

long __thiscall
gl4cts::anon_unknown_0::PlainGatherIntCubeArray::VerifyCompute(PlainGatherIntCubeArray *this)

{
  double dVar1;
  bool bVar2;
  Vector<int,_4> *this_00;
  long lVar3;
  Vector<int,_4> local_58;
  undefined1 local_48 [12];
  float local_3c;
  undefined1 local_38 [8];
  float local_30;
  undefined1 local_28 [4];
  float local_24;
  
  lVar3 = 0;
  this_00 = (Vector<int,_4> *)
            glu::CallLogWrapper::glMapBufferRange
                      (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper,0x90d2,0,0x10,1);
  local_58.m_data[0] = 0;
  local_58.m_data[1] = 4;
  local_58.m_data[2] = 8;
  local_58.m_data[3] = 0xc;
  bVar2 = tcu::Vector<int,_4>::operator!=(this_00,&local_58);
  if (bVar2) {
    (*(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x20])
              (&local_58,this);
    dVar1 = (double)(float)local_58.m_data[0];
    (*(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x20])
              (local_28,this);
    (*(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x20])
              (local_38,this);
    (*(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x20])
              (local_48,this);
    anon_unknown_0::Output
              ("Expected %d, %d, %d, %d, got: %d, %d, %d, %d",SUB84(dVar1,0),(double)local_24,
               (double)local_30,(double)local_3c,(ulong)(uint)this_00->m_data[0],
               (ulong)(uint)this_00->m_data[1],(ulong)(uint)this_00->m_data[2],
               (ulong)(uint)this_00->m_data[3]);
    lVar3 = -1;
  }
  return lVar3;
}

Assistant:

virtual long VerifyCompute()
	{
		IVec4* data;
		data = static_cast<IVec4*>(glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(IVec4), GL_MAP_READ_BIT));
		if (data[0] != IVec4(0, 4, 8, 12))
		{
			Output("Expected %d, %d, %d, %d, got: %d, %d, %d, %d", Expected().x(), Expected().y(), Expected().z(),
				   Expected().w(), data[0].x(), data[0].y(), data[0].z(), data[0].w());
			return ERROR;
		}
		return NO_ERROR;
	}